

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cc
# Opt level: O0

bool wabt::IsValidUtf8(char *s,size_t s_length)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  uint8_t c;
  bool bVar4;
  uint8_t *puVar5;
  uint8_t cu3;
  uint8_t cu2_1;
  uint8_t cu1_1;
  uint8_t cu2;
  uint8_t cu1;
  int length;
  uint8_t cu0;
  uint8_t *end;
  uint8_t *p;
  size_t s_length_local;
  char *s_local;
  
  end = (uint8_t *)s;
  while( true ) {
    if (s + s_length <= end) {
      return true;
    }
    bVar1 = *end;
    if (s + s_length < end + *(int *)((anonymous_namespace)::s_utf8_length + (ulong)bVar1 * 4))
    break;
    switch(*(int *)((anonymous_namespace)::s_utf8_length + (ulong)bVar1 * 4)) {
    case 0:
      return false;
    case 1:
      end = end + 1;
      break;
    case 2:
      puVar5 = end + 1;
      end = end + 2;
      bVar4 = anon_unknown_0::IsCont(*puVar5);
      if (!bVar4) {
        return false;
      }
      break;
    case 3:
      puVar5 = end + 2;
      bVar2 = end[1];
      end = end + 3;
      uVar3 = *puVar5;
      bVar4 = anon_unknown_0::IsCont(bVar2);
      if ((((!bVar4) || (bVar4 = anon_unknown_0::IsCont(uVar3), !bVar4)) ||
          ((bVar1 == 0xe0 && (bVar2 < 0xa0)))) || ((bVar1 == 0xed && (0x9f < bVar2)))) {
        return false;
      }
      break;
    case 4:
      bVar2 = end[1];
      puVar5 = end + 3;
      uVar3 = end[2];
      end = end + 4;
      c = *puVar5;
      bVar4 = anon_unknown_0::IsCont(bVar2);
      if (((((!bVar4) || (bVar4 = anon_unknown_0::IsCont(uVar3), !bVar4)) ||
           (bVar4 = anon_unknown_0::IsCont(c), !bVar4)) || ((bVar1 == 0xf0 && (bVar2 < 0x90)))) ||
         ((bVar1 == 0xf4 && (0x8f < bVar2)))) {
        return false;
      }
    }
  }
  return false;
}

Assistant:

bool IsValidUtf8(const char* s, size_t s_length) {
  const uint8_t* p = reinterpret_cast<const uint8_t*>(s);
  const uint8_t* end = p + s_length;
  while (p < end) {
    uint8_t cu0 = *p;
    int length = s_utf8_length[cu0];
    if (p + length > end) {
      return false;
    }

    switch (length) {
      case 0:
        return false;

      case 1:
        p++;
        break;

      case 2:
        p++;
        if (!IsCont(*p++)) {
          return false;
        }
        break;

      case 3: {
        p++;
        uint8_t cu1 = *p++;
        uint8_t cu2 = *p++;
        if (!(IsCont(cu1) && IsCont(cu2)) ||
            (cu0 == 0xe0 && cu1 < 0xa0) ||  // Overlong encoding.
            (cu0 == 0xed && cu1 >= 0xa0))   // UTF-16 surrogate halves.
          return false;
        break;
      }

      case 4: {
        p++;
        uint8_t cu1 = *p++;
        uint8_t cu2 = *p++;
        uint8_t cu3 = *p++;
        if (!(IsCont(cu1) && IsCont(cu2) && IsCont(cu3)) ||
            (cu0 == 0xf0 && cu1 < 0x90) ||  // Overlong encoding.
            (cu0 == 0xf4 && cu1 >= 0x90))   // Code point >= 0x11000.
          return false;
        break;
      }
    }
  }
  return true;
}